

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

UBool __thiscall
icu_63::DateFormatSymbols::operator==(DateFormatSymbols *this,DateFormatSymbols *other)

{
  bool bVar1;
  UBool UVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  if (this == other) {
    return '\x01';
  }
  if ((((((this->fErasCount == other->fErasCount) && (this->fEraNamesCount == other->fEraNamesCount)
         ) && (this->fNarrowErasCount == other->fNarrowErasCount)) &&
       (((this->fMonthsCount == other->fMonthsCount &&
         (this->fShortMonthsCount == other->fShortMonthsCount)) &&
        ((this->fNarrowMonthsCount == other->fNarrowMonthsCount &&
         ((this->fStandaloneMonthsCount == other->fStandaloneMonthsCount &&
          (this->fStandaloneShortMonthsCount == other->fStandaloneShortMonthsCount)))))))) &&
      ((this->fStandaloneNarrowMonthsCount == other->fStandaloneNarrowMonthsCount &&
       (((((this->fWeekdaysCount == other->fWeekdaysCount &&
           (this->fShortWeekdaysCount == other->fShortWeekdaysCount)) &&
          (this->fShorterWeekdaysCount == other->fShorterWeekdaysCount)) &&
         ((this->fNarrowWeekdaysCount == other->fNarrowWeekdaysCount &&
          (this->fStandaloneWeekdaysCount == other->fStandaloneWeekdaysCount)))) &&
        (this->fStandaloneShortWeekdaysCount == other->fStandaloneShortWeekdaysCount)))))) &&
     (((((((this->fStandaloneShorterWeekdaysCount == other->fStandaloneShorterWeekdaysCount &&
           (this->fStandaloneNarrowWeekdaysCount == other->fStandaloneNarrowWeekdaysCount)) &&
          (((((this->fAmPmsCount == other->fAmPmsCount &&
              (((this->fNarrowAmPmsCount == other->fNarrowAmPmsCount &&
                (this->fQuartersCount == other->fQuartersCount)) &&
               (this->fShortQuartersCount == other->fShortQuartersCount)))) &&
             (((this->fStandaloneQuartersCount == other->fStandaloneQuartersCount &&
               (this->fStandaloneShortQuartersCount == other->fStandaloneShortQuartersCount)) &&
              (this->fLeapMonthPatternsCount == other->fLeapMonthPatternsCount)))) &&
            ((this->fShortYearNamesCount == other->fShortYearNamesCount &&
             (this->fShortZodiacNamesCount == other->fShortZodiacNamesCount)))) &&
           ((this->fAbbreviatedDayPeriodsCount == other->fAbbreviatedDayPeriodsCount &&
            (((this->fWideDayPeriodsCount == other->fWideDayPeriodsCount &&
              (this->fNarrowDayPeriodsCount == other->fNarrowDayPeriodsCount)) &&
             (this->fStandaloneAbbreviatedDayPeriodsCount ==
              other->fStandaloneAbbreviatedDayPeriodsCount)))))))) &&
         ((this->fStandaloneWideDayPeriodsCount == other->fStandaloneWideDayPeriodsCount &&
          (this->fStandaloneNarrowDayPeriodsCount == other->fStandaloneNarrowDayPeriodsCount)))) &&
        (auVar5[0] = -(other->fCapitalization[0][0] == this->fCapitalization[0][0]),
        auVar5[1] = -(other->fCapitalization[0][1] == this->fCapitalization[0][1]),
        auVar5[2] = -(other->fCapitalization[1][0] == this->fCapitalization[1][0]),
        auVar5[3] = -(other->fCapitalization[1][1] == this->fCapitalization[1][1]),
        auVar5[4] = -(other->fCapitalization[2][0] == this->fCapitalization[2][0]),
        auVar5[5] = -(other->fCapitalization[2][1] == this->fCapitalization[2][1]),
        auVar5[6] = -(other->fCapitalization[3][0] == this->fCapitalization[3][0]),
        auVar5[7] = -(other->fCapitalization[3][1] == this->fCapitalization[3][1]),
        auVar5[8] = -(other->fCapitalization[4][0] == this->fCapitalization[4][0]),
        auVar5[9] = -(other->fCapitalization[4][1] == this->fCapitalization[4][1]),
        auVar5[10] = -(other->fCapitalization[5][0] == this->fCapitalization[5][0]),
        auVar5[0xb] = -(other->fCapitalization[5][1] == this->fCapitalization[5][1]),
        auVar5[0xc] = -(other->fCapitalization[6][0] == this->fCapitalization[6][0]),
        auVar5[0xd] = -(other->fCapitalization[6][1] == this->fCapitalization[6][1]),
        auVar5[0xe] = -(other->fCapitalization[7][0] == this->fCapitalization[7][0]),
        auVar5[0xf] = -(other->fCapitalization[7][1] == this->fCapitalization[7][1]),
        auVar4[0] = -(other->fCapitalization[6][0] == this->fCapitalization[6][0]),
        auVar4[1] = -(other->fCapitalization[6][1] == this->fCapitalization[6][1]),
        auVar4[2] = -(other->fCapitalization[7][0] == this->fCapitalization[7][0]),
        auVar4[3] = -(other->fCapitalization[7][1] == this->fCapitalization[7][1]),
        auVar4[4] = -(other->fCapitalization[8][0] == this->fCapitalization[8][0]),
        auVar4[5] = -(other->fCapitalization[8][1] == this->fCapitalization[8][1]),
        auVar4[6] = -(other->fCapitalization[9][0] == this->fCapitalization[9][0]),
        auVar4[7] = -(other->fCapitalization[9][1] == this->fCapitalization[9][1]),
        auVar4[8] = -(other->fCapitalization[10][0] == this->fCapitalization[10][0]),
        auVar4[9] = -(other->fCapitalization[10][1] == this->fCapitalization[10][1]),
        auVar4[10] = -(other->fCapitalization[0xb][0] == this->fCapitalization[0xb][0]),
        auVar4[0xb] = -(other->fCapitalization[0xb][1] == this->fCapitalization[0xb][1]),
        auVar4[0xc] = -(other->fCapitalization[0xc][0] == this->fCapitalization[0xc][0]),
        auVar4[0xd] = -(other->fCapitalization[0xc][1] == this->fCapitalization[0xc][1]),
        auVar4[0xe] = -(other->fCapitalization[0xd][0] == this->fCapitalization[0xd][0]),
        auVar4[0xf] = -(other->fCapitalization[0xd][1] == this->fCapitalization[0xd][1]),
        auVar4 = auVar4 & auVar5,
        (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff)) &&
       (((((UVar2 = arrayCompare(this->fEras,other->fEras,this->fErasCount), UVar2 != '\0' &&
           (UVar2 = arrayCompare(this->fEraNames,other->fEraNames,this->fEraNamesCount),
           UVar2 != '\0')) &&
          ((UVar2 = arrayCompare(this->fNarrowEras,other->fNarrowEras,this->fNarrowErasCount),
           UVar2 != '\0' &&
           ((((UVar2 = arrayCompare(this->fMonths,other->fMonths,this->fMonthsCount), UVar2 != '\0'
              && (UVar2 = arrayCompare(this->fShortMonths,other->fShortMonths,
                                       this->fShortMonthsCount), UVar2 != '\0')) &&
             (UVar2 = arrayCompare(this->fNarrowMonths,other->fNarrowMonths,this->fNarrowMonthsCount
                                  ), UVar2 != '\0')) &&
            ((UVar2 = arrayCompare(this->fStandaloneMonths,other->fStandaloneMonths,
                                   this->fStandaloneMonthsCount), UVar2 != '\0' &&
             (UVar2 = arrayCompare(this->fStandaloneShortMonths,other->fStandaloneShortMonths,
                                   this->fStandaloneShortMonthsCount), UVar2 != '\0')))))))) &&
         (UVar2 = arrayCompare(this->fStandaloneNarrowMonths,other->fStandaloneNarrowMonths,
                               this->fStandaloneNarrowMonthsCount), UVar2 != '\0')) &&
        (((UVar2 = arrayCompare(this->fWeekdays,other->fWeekdays,this->fWeekdaysCount),
          UVar2 != '\0' &&
          (UVar2 = arrayCompare(this->fShortWeekdays,other->fShortWeekdays,this->fShortWeekdaysCount
                               ), UVar2 != '\0')) &&
         (((UVar2 = arrayCompare(this->fShorterWeekdays,other->fShorterWeekdays,
                                 this->fShorterWeekdaysCount), UVar2 != '\0' &&
           (((UVar2 = arrayCompare(this->fNarrowWeekdays,other->fNarrowWeekdays,
                                   this->fNarrowWeekdaysCount), UVar2 != '\0' &&
             (UVar2 = arrayCompare(this->fStandaloneWeekdays,other->fStandaloneWeekdays,
                                   this->fStandaloneWeekdaysCount), UVar2 != '\0')) &&
            (UVar2 = arrayCompare(this->fStandaloneShortWeekdays,other->fStandaloneShortWeekdays,
                                  this->fStandaloneShortWeekdaysCount), UVar2 != '\0')))) &&
          (((UVar2 = arrayCompare(this->fStandaloneShorterWeekdays,other->fStandaloneShorterWeekdays
                                  ,this->fStandaloneShorterWeekdaysCount), UVar2 != '\0' &&
            (UVar2 = arrayCompare(this->fStandaloneNarrowWeekdays,other->fStandaloneNarrowWeekdays,
                                  this->fStandaloneNarrowWeekdaysCount), UVar2 != '\0')) &&
           (UVar2 = arrayCompare(this->fAmPms,other->fAmPms,this->fAmPmsCount), UVar2 != '\0')))))))
        ))) && (((UVar2 = arrayCompare(this->fNarrowAmPms,other->fNarrowAmPms,
                                       this->fNarrowAmPmsCount), UVar2 != '\0' &&
                 (UVar2 = icu_63::UnicodeString::operator==
                                    (&this->fTimeSeparator,&other->fTimeSeparator), UVar2 != '\0'))
                && (((UVar2 = arrayCompare(this->fQuarters,other->fQuarters,this->fQuartersCount),
                     UVar2 != '\0' &&
                     (((UVar2 = arrayCompare(this->fShortQuarters,other->fShortQuarters,
                                             this->fShortQuartersCount), UVar2 != '\0' &&
                       (UVar2 = arrayCompare(this->fStandaloneQuarters,other->fStandaloneQuarters,
                                             this->fStandaloneQuartersCount), UVar2 != '\0')) &&
                      (UVar2 = arrayCompare(this->fStandaloneShortQuarters,
                                            other->fStandaloneShortQuarters,
                                            this->fStandaloneShortQuartersCount), UVar2 != '\0'))))
                    && (((UVar2 = arrayCompare(this->fLeapMonthPatterns,other->fLeapMonthPatterns,
                                               this->fLeapMonthPatternsCount), UVar2 != '\0' &&
                         (UVar2 = arrayCompare(this->fShortYearNames,other->fShortYearNames,
                                               this->fShortYearNamesCount), UVar2 != '\0')) &&
                        ((UVar2 = arrayCompare(this->fShortZodiacNames,other->fShortZodiacNames,
                                               this->fShortZodiacNamesCount), UVar2 != '\0' &&
                         (((UVar2 = arrayCompare(this->fAbbreviatedDayPeriods,
                                                 other->fAbbreviatedDayPeriods,
                                                 this->fAbbreviatedDayPeriodsCount), UVar2 != '\0'
                           && (UVar2 = arrayCompare(this->fWideDayPeriods,other->fWideDayPeriods,
                                                    this->fWideDayPeriodsCount), UVar2 != '\0')) &&
                          ((UVar2 = arrayCompare(this->fNarrowDayPeriods,other->fNarrowDayPeriods,
                                                 this->fNarrowDayPeriodsCount), UVar2 != '\0' &&
                           (((UVar2 = arrayCompare(this->fStandaloneAbbreviatedDayPeriods,
                                                   other->fStandaloneAbbreviatedDayPeriods,
                                                   this->fStandaloneAbbreviatedDayPeriodsCount),
                             UVar2 != '\0' &&
                             (UVar2 = arrayCompare(this->fStandaloneWideDayPeriods,
                                                   other->fStandaloneWideDayPeriods,
                                                   this->fStandaloneWideDayPeriodsCount),
                             UVar2 != '\0')) &&
                            (UVar2 = arrayCompare(this->fStandaloneNarrowDayPeriods,
                                                  other->fStandaloneNarrowDayPeriods,
                                                  this->fStandaloneWideDayPeriodsCount),
                            UVar2 != '\0')))))))))))))))))) {
    if (this->fZoneStrings == (UnicodeString **)0x0 && other->fZoneStrings == (UnicodeString **)0x0)
    {
      UVar2 = Locale::operator==(&this->fZSFLocale,&other->fZSFLocale);
      if (UVar2 != '\0') {
        return '\x01';
      }
    }
    else if (((this->fZoneStrings != (UnicodeString **)0x0 &&
               other->fZoneStrings != (UnicodeString **)0x0) &&
             (this->fZoneStringsRowCount == other->fZoneStringsRowCount)) &&
            (this->fZoneStringsColCount == other->fZoneStringsColCount)) {
      if (this->fZoneStringsRowCount < 1) {
        return '\x01';
      }
      lVar3 = 1;
      do {
        UVar2 = arrayCompare(this->fZoneStrings[lVar3 + -1],other->fZoneStrings[lVar3 + -1],
                             this->fZoneStringsColCount);
        if (UVar2 == '\0') {
          return '\0';
        }
        bVar1 = lVar3 < this->fZoneStringsRowCount;
        lVar3 = lVar3 + 1;
      } while (bVar1);
      return UVar2;
    }
  }
  return '\0';
}

Assistant:

UBool
DateFormatSymbols::operator==(const DateFormatSymbols& other) const
{
    // First do cheap comparisons
    if (this == &other) {
        return TRUE;
    }
    if (fErasCount == other.fErasCount &&
        fEraNamesCount == other.fEraNamesCount &&
        fNarrowErasCount == other.fNarrowErasCount &&
        fMonthsCount == other.fMonthsCount &&
        fShortMonthsCount == other.fShortMonthsCount &&
        fNarrowMonthsCount == other.fNarrowMonthsCount &&
        fStandaloneMonthsCount == other.fStandaloneMonthsCount &&
        fStandaloneShortMonthsCount == other.fStandaloneShortMonthsCount &&
        fStandaloneNarrowMonthsCount == other.fStandaloneNarrowMonthsCount &&
        fWeekdaysCount == other.fWeekdaysCount &&
        fShortWeekdaysCount == other.fShortWeekdaysCount &&
        fShorterWeekdaysCount == other.fShorterWeekdaysCount &&
        fNarrowWeekdaysCount == other.fNarrowWeekdaysCount &&
        fStandaloneWeekdaysCount == other.fStandaloneWeekdaysCount &&
        fStandaloneShortWeekdaysCount == other.fStandaloneShortWeekdaysCount &&
        fStandaloneShorterWeekdaysCount == other.fStandaloneShorterWeekdaysCount &&
        fStandaloneNarrowWeekdaysCount == other.fStandaloneNarrowWeekdaysCount &&
        fAmPmsCount == other.fAmPmsCount &&
        fNarrowAmPmsCount == other.fNarrowAmPmsCount &&
        fQuartersCount == other.fQuartersCount &&
        fShortQuartersCount == other.fShortQuartersCount &&
        fStandaloneQuartersCount == other.fStandaloneQuartersCount &&
        fStandaloneShortQuartersCount == other.fStandaloneShortQuartersCount &&
        fLeapMonthPatternsCount == other.fLeapMonthPatternsCount &&
        fShortYearNamesCount == other.fShortYearNamesCount &&
        fShortZodiacNamesCount == other.fShortZodiacNamesCount &&
        fAbbreviatedDayPeriodsCount == other.fAbbreviatedDayPeriodsCount &&
        fWideDayPeriodsCount == other.fWideDayPeriodsCount &&
        fNarrowDayPeriodsCount == other.fNarrowDayPeriodsCount &&
        fStandaloneAbbreviatedDayPeriodsCount == other.fStandaloneAbbreviatedDayPeriodsCount &&
        fStandaloneWideDayPeriodsCount == other.fStandaloneWideDayPeriodsCount &&
        fStandaloneNarrowDayPeriodsCount == other.fStandaloneNarrowDayPeriodsCount &&
        (uprv_memcmp(fCapitalization, other.fCapitalization, sizeof(fCapitalization))==0))
    {
        // Now compare the arrays themselves
        if (arrayCompare(fEras, other.fEras, fErasCount) &&
            arrayCompare(fEraNames, other.fEraNames, fEraNamesCount) &&
            arrayCompare(fNarrowEras, other.fNarrowEras, fNarrowErasCount) &&
            arrayCompare(fMonths, other.fMonths, fMonthsCount) &&
            arrayCompare(fShortMonths, other.fShortMonths, fShortMonthsCount) &&
            arrayCompare(fNarrowMonths, other.fNarrowMonths, fNarrowMonthsCount) &&
            arrayCompare(fStandaloneMonths, other.fStandaloneMonths, fStandaloneMonthsCount) &&
            arrayCompare(fStandaloneShortMonths, other.fStandaloneShortMonths, fStandaloneShortMonthsCount) &&
            arrayCompare(fStandaloneNarrowMonths, other.fStandaloneNarrowMonths, fStandaloneNarrowMonthsCount) &&
            arrayCompare(fWeekdays, other.fWeekdays, fWeekdaysCount) &&
            arrayCompare(fShortWeekdays, other.fShortWeekdays, fShortWeekdaysCount) &&
            arrayCompare(fShorterWeekdays, other.fShorterWeekdays, fShorterWeekdaysCount) &&
            arrayCompare(fNarrowWeekdays, other.fNarrowWeekdays, fNarrowWeekdaysCount) &&
            arrayCompare(fStandaloneWeekdays, other.fStandaloneWeekdays, fStandaloneWeekdaysCount) &&
            arrayCompare(fStandaloneShortWeekdays, other.fStandaloneShortWeekdays, fStandaloneShortWeekdaysCount) &&
            arrayCompare(fStandaloneShorterWeekdays, other.fStandaloneShorterWeekdays, fStandaloneShorterWeekdaysCount) &&
            arrayCompare(fStandaloneNarrowWeekdays, other.fStandaloneNarrowWeekdays, fStandaloneNarrowWeekdaysCount) &&
            arrayCompare(fAmPms, other.fAmPms, fAmPmsCount) &&
            arrayCompare(fNarrowAmPms, other.fNarrowAmPms, fNarrowAmPmsCount) &&
            fTimeSeparator == other.fTimeSeparator &&
            arrayCompare(fQuarters, other.fQuarters, fQuartersCount) &&
            arrayCompare(fShortQuarters, other.fShortQuarters, fShortQuartersCount) &&
            arrayCompare(fStandaloneQuarters, other.fStandaloneQuarters, fStandaloneQuartersCount) &&
            arrayCompare(fStandaloneShortQuarters, other.fStandaloneShortQuarters, fStandaloneShortQuartersCount) &&
            arrayCompare(fLeapMonthPatterns, other.fLeapMonthPatterns, fLeapMonthPatternsCount) &&
            arrayCompare(fShortYearNames, other.fShortYearNames, fShortYearNamesCount) &&
            arrayCompare(fShortZodiacNames, other.fShortZodiacNames, fShortZodiacNamesCount) &&
            arrayCompare(fAbbreviatedDayPeriods, other.fAbbreviatedDayPeriods, fAbbreviatedDayPeriodsCount) &&
            arrayCompare(fWideDayPeriods, other.fWideDayPeriods, fWideDayPeriodsCount) &&
            arrayCompare(fNarrowDayPeriods, other.fNarrowDayPeriods, fNarrowDayPeriodsCount) &&
            arrayCompare(fStandaloneAbbreviatedDayPeriods, other.fStandaloneAbbreviatedDayPeriods,
                         fStandaloneAbbreviatedDayPeriodsCount) &&
            arrayCompare(fStandaloneWideDayPeriods, other.fStandaloneWideDayPeriods,
                         fStandaloneWideDayPeriodsCount) &&
            arrayCompare(fStandaloneNarrowDayPeriods, other.fStandaloneNarrowDayPeriods,
                         fStandaloneWideDayPeriodsCount))
        {
            // Compare the contents of fZoneStrings
            if (fZoneStrings == NULL && other.fZoneStrings == NULL) {
                if (fZSFLocale == other.fZSFLocale) {
                    return TRUE;
                }
            } else if (fZoneStrings != NULL && other.fZoneStrings != NULL) {
                if (fZoneStringsRowCount == other.fZoneStringsRowCount
                    && fZoneStringsColCount == other.fZoneStringsColCount) {
                    UBool cmpres = TRUE;
                    for (int32_t i = 0; (i < fZoneStringsRowCount) && cmpres; i++) {
                        cmpres = arrayCompare(fZoneStrings[i], other.fZoneStrings[i], fZoneStringsColCount);
                    }
                    return cmpres;
                }
            }
            return FALSE;
        }
    }
    return FALSE;
}